

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3IndexAffinityStr(Vdbe *v,Index *pIdx)

{
  Table *pTVar1;
  sqlite3 *psVar2;
  char *pcVar3;
  sqlite3 *db;
  Table *pTab;
  int n;
  Index *pIdx_local;
  Vdbe *v_local;
  
  if (pIdx->zColAff == (char *)0x0) {
    pTVar1 = pIdx->pTable;
    psVar2 = sqlite3VdbeDb(v);
    pcVar3 = (char *)sqlite3DbMallocRaw((sqlite3 *)0x0,pIdx->nColumn + 2);
    pIdx->zColAff = pcVar3;
    if (pIdx->zColAff == (char *)0x0) {
      psVar2->mallocFailed = '\x01';
      return (char *)0x0;
    }
    for (pTab._4_4_ = 0; pTab._4_4_ < (int)(uint)pIdx->nColumn; pTab._4_4_ = pTab._4_4_ + 1) {
      pIdx->zColAff[pTab._4_4_] = pTVar1->aCol[pIdx->aiColumn[pTab._4_4_]].affinity;
    }
    pIdx->zColAff[pTab._4_4_] = 'd';
    pIdx->zColAff[pTab._4_4_ + 1] = '\0';
  }
  return pIdx->zColAff;
}

Assistant:

SQLITE_PRIVATE const char *sqlite3IndexAffinityStr(Vdbe *v, Index *pIdx){
  if( !pIdx->zColAff ){
    /* The first time a column affinity string for a particular index is
    ** required, it is allocated and populated here. It is then stored as
    ** a member of the Index structure for subsequent use.
    **
    ** The column affinity string will eventually be deleted by
    ** sqliteDeleteIndex() when the Index structure itself is cleaned
    ** up.
    */
    int n;
    Table *pTab = pIdx->pTable;
    sqlite3 *db = sqlite3VdbeDb(v);
    pIdx->zColAff = (char *)sqlite3DbMallocRaw(0, pIdx->nColumn+2);
    if( !pIdx->zColAff ){
      db->mallocFailed = 1;
      return 0;
    }
    for(n=0; n<pIdx->nColumn; n++){
      pIdx->zColAff[n] = pTab->aCol[pIdx->aiColumn[n]].affinity;
    }
    pIdx->zColAff[n++] = SQLITE_AFF_INTEGER;
    pIdx->zColAff[n] = 0;
  }
 
  return pIdx->zColAff;
}